

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status leveldb::anon_unknown_1::PosixError(string *context,int error_number)

{
  int in_ECX;
  Code code;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  Slice local_40;
  Slice local_30;
  char *local_20;
  
  local_30.data_ = (char *)CONCAT44(in_register_00000034,error_number);
  local_20 = *(char **)(in_FS_OFFSET + 0x28);
  if (in_ECX == 2) {
    local_40.data_ = strerror(2);
    local_40.size_ = strlen(local_40.data_);
    code = kNotFound;
  }
  else {
    local_40.data_ = strerror(in_ECX);
    local_40.size_ = strlen(local_40.data_);
    code = kIOError;
  }
  Status::Status((Status *)context,code,&local_30,&local_40);
  if (*(char **)(in_FS_OFFSET + 0x28) == local_20) {
    return (Status)*(char **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

Status PosixError(const std::string& context, int error_number) {
  if (error_number == ENOENT) {
    return Status::NotFound(context, std::strerror(error_number));
  } else {
    return Status::IOError(context, std::strerror(error_number));
  }
}